

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::FindPlatformMonitorForPos(ImVec2 *pos)

{
  bool bVar1;
  ImGuiPlatformMonitor *lhs;
  ImVec2 *in_RDI;
  ImGuiPlatformMonitor *monitor;
  int monitor_n;
  ImGuiContext *g;
  ImVec2 local_40;
  ImRect local_38;
  ImGuiPlatformMonitor *local_28;
  int local_1c;
  ImGuiContext *local_18;
  ImVec2 *local_10;
  
  local_18 = GImGui;
  local_1c = 0;
  local_10 = in_RDI;
  while( true ) {
    if ((local_18->PlatformIO).Monitors.Size <= local_1c) {
      return -1;
    }
    lhs = ImVector<ImGuiPlatformMonitor>::operator[](&(local_18->PlatformIO).Monitors,local_1c);
    local_28 = lhs;
    local_40 = ::operator+(&lhs->MainPos,(ImVec2 *)0x1d1b4d);
    ImRect::ImRect(&local_38,&lhs->MainPos,&local_40);
    bVar1 = ImRect::Contains(&local_38,local_10);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

static int ImGui::FindPlatformMonitorForPos(const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    for (int monitor_n = 0; monitor_n < g.PlatformIO.Monitors.Size; monitor_n++)
    {
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[monitor_n];
        if (ImRect(monitor.MainPos, monitor.MainPos + monitor.MainSize).Contains(pos))
            return monitor_n;
    }
    return -1;
}